

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_control_block.hpp
# Opt level: O0

bool Fossilize::shared_control_block_write
               (SharedControlBlock *control_block,void *data_,uint32_t size)

{
  void *__dest;
  uint local_40;
  uint32_t write_second;
  uint32_t write_first;
  uint32_t max_capacity_write_count;
  uint8_t *ring;
  uint8_t *data;
  uint32_t size_local;
  void *data__local;
  SharedControlBlock *control_block_local;
  
  __dest = (void *)((long)&control_block->version_cookie + (ulong)control_block->ring_buffer_offset)
  ;
  if (control_block->ring_buffer_size < size) {
    control_block_local._7_1_ = false;
  }
  else if (control_block->read_count + control_block->ring_buffer_size <
           control_block->write_count + size) {
    control_block_local._7_1_ = false;
  }
  else {
    local_40 = control_block->ring_buffer_size - control_block->write_offset;
    if (size < local_40) {
      local_40 = size;
    }
    memcpy((void *)((long)__dest + (ulong)control_block->write_offset),data_,(ulong)local_40);
    if (size - local_40 != 0) {
      memcpy(__dest,(void *)((long)data_ + (ulong)local_40),(ulong)(size - local_40));
    }
    control_block->write_offset =
         control_block->write_offset + size & control_block->ring_buffer_size - 1;
    control_block->write_count = size + control_block->write_count;
    control_block_local._7_1_ = true;
  }
  return control_block_local._7_1_;
}

Assistant:

static inline bool shared_control_block_write(SharedControlBlock *control_block,
                                              const void *data_, uint32_t size)
{
	auto *data = static_cast<const uint8_t *>(data_);
	uint8_t *ring = reinterpret_cast<uint8_t *>(control_block) + control_block->ring_buffer_offset;

	if (size > control_block->ring_buffer_size)
		return false;

	uint32_t max_capacity_write_count = control_block->read_count + control_block->ring_buffer_size;
	if (control_block->write_count + size > max_capacity_write_count)
		return false;

	uint32_t write_first = control_block->ring_buffer_size - control_block->write_offset;
	uint32_t write_second = 0;
	if (write_first > size)
		write_first = size;
	write_second = size - write_first;

	memcpy(ring + control_block->write_offset, data, write_first);
	if (write_second)
		memcpy(ring, data + write_first, write_second);

	control_block->write_offset = (control_block->write_offset + size) & (control_block->ring_buffer_size - 1);
	control_block->write_count += size;

	return true;
}